

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

com_core_t * com_core_init(com_seqh_t *seqhdr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  pel *ppVar7;
  com_sao_param_t (*pacVar8) [3];
  ulong uVar9;
  long lVar10;
  com_core_t *__s;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  s8 *psVar15;
  size_t __n;
  long local_50;
  long local_48;
  long local_40;
  
  pvVar4 = malloc(0x480f);
  if (pvVar4 != (void *)0x0) {
    __s = (com_core_t *)((long)pvVar4 + 0x27U & 0xffffffffffffffe0);
    *(void **)&__s[-1].pathdr = pvVar4;
    lVar13 = 0;
    memset(__s,0,0x47e8);
    iVar3 = seqhdr->f_scu;
    __n = (size_t)iVar3;
    iVar1 = seqhdr->f_lcu;
    iVar2 = seqhdr->pic_width;
    iVar3 = iVar3 * 3 + (iVar2 + iVar3) * 4 + iVar1 * 2 + 0x158;
    if (seqhdr->sample_adaptive_offset_enable_flag == '\0') {
      local_48 = 0;
      local_40 = 0;
    }
    else {
      lVar13 = (long)iVar2 + 0x4643;
      uVar12 = iVar2 - (iVar2 >> 0x1f) & 0xfffffffe;
      iVar3 = iVar3 + iVar1 * 0x84 + (int)lVar13 + uVar12 + 0x26e3;
      local_48 = (long)(int)(uVar12 + 0x2686);
      local_40 = (long)(iVar1 * 0x84);
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag == '\0') {
      lVar11 = 0;
      local_50 = 0;
    }
    else {
      lVar11 = (long)iVar2 + 0x52c0;
      uVar12 = iVar2 - (iVar2 >> 0x1f) & 0xfffffffe;
      iVar3 = iVar3 + iVar1 * 3 + (int)lVar11 + uVar12 + 0x33dd;
      local_50 = (long)(int)(uVar12 + 0x3380);
    }
    pvVar5 = malloc((long)iVar3 + 0x27);
    if (pvVar5 != (void *)0x0) {
      pvVar4 = (void *)((long)pvVar5 + 0x27U & 0xffffffffffffffe0);
      *(void **)((long)pvVar4 + -8) = pvVar5;
      memset(pvVar4,0,(long)iVar3);
      (__s->map).map_base = pvVar4;
      uVar14 = (long)pvVar4 + __n + 0x1f & 0xffffffffffffffe0;
      memset(pvVar4,0,__n);
      lVar6 = (long)seqhdr->i_scu;
      (__s->map).map_scu = (com_scu_t *)((long)pvVar4 + lVar6 + 1);
      uVar9 = __n + uVar14 + 0x1f & 0xffffffffffffffe0;
      (__s->map).map_ipm = (s8 *)(lVar6 + uVar14 + 1);
      pvVar4 = (void *)(uVar9 + __n * 4 + 0x1f & 0xffffffffffffffe0);
      (__s->map).map_pos = (u32 *)(uVar9 + lVar6 * 4 + 4);
      psVar15 = (s8 *)((long)pvVar4 + __n + 0x1f & 0xffffffffffffffe0);
      memset(pvVar4,0,__n);
      (__s->map).map_edge = (u8 *)((long)pvVar4 + (long)seqhdr->i_scu + 1);
      (__s->map).map_patch = psVar15;
      iVar3 = seqhdr->f_lcu;
      psVar15 = (s8 *)((ulong)(psVar15 + (long)iVar3 + 0x1f) & 0xffffffffffffffe0);
      (__s->map).map_qp = psVar15;
      ppVar7 = (pel *)((ulong)(psVar15 + (long)iVar3 + 0x1f) & 0xffffffffffffffe0);
      __s->linebuf_intra[0] = ppVar7;
      lVar10 = (long)seqhdr->pic_width;
      ppVar7 = (pel *)((ulong)(ppVar7 + lVar10 + 0x1f) & 0xffffffffffffffe0);
      __s->linebuf_intra[1] = ppVar7;
      uVar9 = (ulong)(ppVar7 + lVar10 + 0x1f) & 0xffffffffffffffe0;
      lVar6 = uVar9 + lVar10;
      lVar6 = lVar6 - (ulong)((int)lVar6 + 0x20U & 0x1f);
      __s->linebuf_sao[0] = (pel *)(uVar9 + 1);
      lVar10 = lVar6 + lVar10;
      ppVar7 = (pel *)((lVar10 - (ulong)((int)lVar10 + 0x41U & 0x1f)) + 0x41);
      __s->linebuf_sao[1] = (pel *)(lVar6 + 0x22);
      if (seqhdr->sample_adaptive_offset_enable_flag != '\0') {
        __s->sao_src_buf[0] = ppVar7;
        __s->sao_src_buf[1] = (pel *)((ulong)(ppVar7 + lVar13 + 0x1f) & 0xffffffffffffffe0);
        pacVar8 = (com_sao_param_t (*) [3])
                  ((ulong)((pel *)((ulong)(ppVar7 + lVar13 + 0x1f) & 0xffffffffffffffe0) +
                          local_48 + 0x1f) & 0xffffffffffffffe0);
        __s->sao_param_map = pacVar8;
        ppVar7 = (pel *)((long)(*pacVar8)[0].offset + local_40 + 7 & 0xffffffffffffffe0);
      }
      if (seqhdr->adaptive_leveling_filter_enable_flag == '\0') {
        return __s;
      }
      __s->alf_src_buf[0] = ppVar7;
      __s->alf_src_buf[1] = (pel *)((ulong)(ppVar7 + lVar11 + 0x1f) & 0xffffffffffffffe0);
      __s->alf_enable_map =
           (u8 (*) [3])
           ((ulong)((pel *)((ulong)(ppVar7 + lVar11 + 0x1f) & 0xffffffffffffffe0) + local_50 + 0x1f)
           & 0xffffffffffffffe0);
      return __s;
    }
    free(pvVar4);
  }
  return (com_core_t *)0x0;
}

Assistant:

com_core_t* com_core_init(com_seqh_t *seqhdr)
{
    int total_mem_size = 0;
    u8 *buf;
    com_map_t *map;
    com_core_t *core = com_malloc(sizeof(com_core_t));
    int sao_l_size = 0, sao_c_size = 0, sao_map_size = 0;
    int alf_l_size = 0, alf_c_size = 0, alf_map_size = 0;

    if (core == NULL) {
        return NULL;
    }

    map = &core->map;

    total_mem_size = ALIGN_MASK     + sizeof(com_scu_t) * seqhdr->f_scu +             // map_scu
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_scu +             // map_ipm
                     ALIGN_MASK     + sizeof(      u32) * seqhdr->f_scu +             // map_pos
                     ALIGN_MASK     + sizeof(       u8) * seqhdr->f_scu +             // map_edge
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_patch
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_qp
                     ALIGN_MASK * 2 + sizeof(pel) * seqhdr->pic_width * 2 +           // linebuf_intra
                     ALIGN_MASK * 2 + sizeof(pel) * (seqhdr->pic_width * 2 + 3) +     // linebuf_sao
                     ALIGN_MASK;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        sao_l_size   = sizeof(pel) * ((MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width + ALIGN_MASK);
        sao_c_size   = sizeof(pel) * ((MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width / 2 + ALIGN_MASK) * 2;
        sao_map_size = sizeof(com_sao_param_t) * N_C * seqhdr->f_lcu;
        total_mem_size += sao_l_size + sao_c_size + sao_map_size + ALIGN_MASK * 3;
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        alf_l_size = sizeof(pel) * ((MAX_CU_SIZE + ALIGN_BASIC) * (MAX_CU_SIZE + 4) + seqhdr->pic_width + ALIGN_BASIC * 2);
        alf_c_size = sizeof(pel) * ((MAX_CU_SIZE / 2 + ALIGN_BASIC) * (MAX_CU_SIZE / 2 + 4) + seqhdr->pic_width / 2 + ALIGN_BASIC * 2) * 2;
        alf_map_size = sizeof(u8) * N_C * seqhdr->f_lcu;
        total_mem_size += alf_l_size + alf_c_size + alf_map_size + ALIGN_MASK * 3;
    }

    map->map_base = buf = com_malloc(total_mem_size);

    if (buf == NULL) {
        com_free(core);
        return NULL;
    }

    buf = ALIGN_POINTER(buf);
    GIVE_BUFFERV(map->map_scu,    buf, sizeof(com_scu_t) * seqhdr->f_scu, 0);   map->map_scu    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_ipm,    buf, sizeof(       s8) * seqhdr->f_scu   );   map->map_ipm    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_pos,    buf, sizeof(      u32) * seqhdr->f_scu   );   map->map_pos    += seqhdr->i_scu + 1;
    GIVE_BUFFERV(map->map_edge,   buf, sizeof(       u8) * seqhdr->f_scu, 0);   map->map_edge   += seqhdr->i_scu + 1;

    GIVE_BUFFER(map->map_patch,  buf, sizeof( s8) * seqhdr->f_lcu);
    GIVE_BUFFER(map->map_qp,     buf, sizeof( s8) * seqhdr->f_lcu);

    GIVE_BUFFER(core->linebuf_intra[0], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_intra[1], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_sao  [0], buf, sizeof(pel) * (seqhdr->pic_width + 1)); core->linebuf_sao[0] += 1;
    GIVE_BUFFER(core->linebuf_sao  [1], buf, sizeof(pel) * (seqhdr->pic_width + 2)); core->linebuf_sao[1] += 2;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        GIVE_BUFFER(core->sao_src_buf[0], buf, sao_l_size);
        GIVE_BUFFER(core->sao_src_buf[1], buf, sao_c_size);
        GIVE_BUFFER(core->sao_param_map,  buf, sao_map_size);
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        GIVE_BUFFER(core->alf_src_buf[0], buf, alf_l_size);
        GIVE_BUFFER(core->alf_src_buf[1], buf, alf_c_size);
        GIVE_BUFFER(core->alf_enable_map, buf, alf_map_size);
    }
    return core;
}